

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme.cpp
# Opt level: O2

string * __thiscall
psy::C::Lexeme::value<std::__cxx11::string>(string *__return_storage_ptr__,Lexeme *this)

{
  string p;
  string local_30;
  
  valueText_abi_cxx11_(&local_30,this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_30._M_dataplus._M_p + 1,
             local_30._M_dataplus._M_p + (local_30._M_string_length - 1));
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexeme::value<std::string>() const
{
    auto p = valueText();
    return std::string(p.c_str() + 1, p.size() - 2);
}